

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  code cVar1;
  ushort uVar2;
  Table *t;
  Table *events;
  Value VVar3;
  TValue *f;
  ushort uVar4;
  TValue *io;
  char *pcVar5;
  
  uVar2 = rb->tt_;
  uVar4 = uVar2 & 0x7f;
  if (uVar4 == 4) {
    if ((uVar2 & 0xf) == 4) {
      if (((byte)(rb->value_).f[8] & 0xf) == 4) {
        VVar3.i._1_7_ = 0;
        VVar3.b._0_1_ = (rb->value_).f[0xb];
LAB_0013c09f:
        ra->value_ = VVar3;
        ra->tt_ = 0x13;
        return;
      }
      pcVar5 = "(((((rb)->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      pcVar5 = "(((((((rb))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x361,"void luaV_objlen(lua_State *, StkId, const TValue *)");
  }
  if (uVar4 != 5) {
    if (uVar4 != 0x14) {
      if ((uVar4 != 0x25) && (uVar4 != 0x15)) {
        f = luaT_gettmbyobj(L,rb,TM_LEN);
        if (f->tt_ == 0) {
          luaG_typeerror(L,rb,"get length of");
        }
LAB_0013c05e:
        luaT_callTM(L,f,rb,rb,ra,1);
        return;
      }
      if ((uVar2 == 0x8015) || (uVar2 == 0x8025)) {
        cVar1 = (rb->value_).f[8];
        if ((cVar1 == (code)0x15) || (cVar1 == (code)0x25)) {
          VVar3._0_4_ = *(int *)((rb->value_).f + 0xc) - 1;
          VVar3.i._4_4_ = 0;
          goto LAB_0013c09f;
        }
        pcVar5 = 
        "((((rb)->value_).gc)->tt == ((5) | ((1) << 4)) || (((rb)->value_).gc)->tt == ((5) | ((2) << 4)))"
        ;
      }
      else {
        pcVar5 = 
        "(((((rb))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((rb))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
        ;
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x355,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    if ((uVar2 & 0xf) == 4) {
      if ((((rb->value_).gc)->tt & 0xf) == 4) {
        VVar3 = *(Value *)((rb->value_).gc + 1);
        goto LAB_0013c09f;
      }
      pcVar5 = "(((((rb)->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      pcVar5 = "(((((((rb))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x365,"void luaV_objlen(lua_State *, StkId, const TValue *)");
  }
  if (uVar2 == 0x8005) {
    t = (Table *)(rb->value_).gc;
    if (t->tt == '\x05') {
      events = t->metatable;
      if ((events != (Table *)0x0) && ((events->flags & 0x10) == 0)) {
        f = luaT_gettm(events,TM_LEN,L->l_G->tmname[4]);
        if (f != (TValue *)0x0) goto LAB_0013c05e;
      }
      VVar3.i = luaH_getn(t);
      goto LAB_0013c09f;
    }
    pcVar5 = "(((rb)->value_).gc)->tt == 5";
  }
  else {
    pcVar5 = "((((rb))->tt_) == (((5) | (1 << 15))))";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x35a,"void luaV_objlen(lua_State *, StkId, const TValue *)");
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttype(rb)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      RaviArray *h = arrvalue(rb);
      setivalue(ra, raviH_getn(h));
      return;
    }
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(ra, luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_TSHRSTR: {
      setivalue(ra, tsvalue(rb)->shrlen);
      return;
    }
    case LUA_TLNGSTR: {
      setivalue(ra, tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (unlikely(ttisnil(tm)))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTM(L, tm, rb, rb, ra, 1);
}